

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnDate::Append(ColumnDate *this,ColumnRef *column)

{
  bool bVar1;
  element_type *this_00;
  Column *in_RDI;
  shared_ptr<clickhouse::ColumnDate> col;
  shared_ptr<clickhouse::ColumnVector<unsigned_short>_> *in_stack_ffffffffffffff98;
  undefined1 local_30 [16];
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ef4da);
  Column::As<clickhouse::ColumnDate>(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<clickhouse::ColumnVector<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1ef505);
    std::__shared_ptr_access<clickhouse::ColumnDate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnDate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ef514);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_short>,void>
              ((shared_ptr<clickhouse::Column> *)this_00,in_stack_ffffffffffffff98);
    (*(this_00->super_Column)._vptr_Column[2])(this_00,local_30);
    std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x1ef549);
  }
  std::shared_ptr<clickhouse::ColumnDate>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnDate> *)0x1ef579);
  return;
}

Assistant:

void ColumnDate::Append(ColumnRef column) {
    if (auto col = column->As<ColumnDate>()) {
        data_->Append(col->data_);
    }
}